

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Maybe<kj::Promise<unsigned_long>_> __thiscall
kj::AsyncIoStreamWithGuards::tryPumpFrom
          (AsyncIoStreamWithGuards *this,AsyncInputStream *input,uint64_t amount)

{
  RefOrVoid<kj::AsyncIoStream> pAVar1;
  undefined8 in_RCX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 aVar2;
  Maybe<kj::Promise<unsigned_long>_> MVar3;
  Type local_50;
  Promise<unsigned_long> local_30;
  undefined8 local_28;
  uint64_t amount_local;
  AsyncInputStream *input_local;
  AsyncIoStreamWithGuards *this_local;
  
  amount_local = amount;
  input_local = input;
  this_local = this;
  if (((ulong)input[9]._vptr_AsyncInputStream & 0x100) == 0) {
    ForkedPromise<void>::addBranch((ForkedPromise<void> *)&local_50);
    Promise<void>::
    then<kj::AsyncIoStreamWithGuards::tryPumpFrom(kj::AsyncInputStream&,unsigned_long)::_lambda()_1_>
              ((Promise<void> *)&local_50.input,&local_50);
    Maybe<kj::Promise<unsigned_long>_>::Maybe
              ((Maybe<kj::Promise<unsigned_long>_> *)this,(Promise<unsigned_long> *)&local_50.input)
    ;
    Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)&local_50.input);
    Promise<void>::~Promise((Promise<void> *)&local_50);
    aVar2 = extraout_RDX_00;
  }
  else {
    local_28 = in_RCX;
    pAVar1 = Own<kj::AsyncIoStream,_std::nullptr_t>::operator*
                       ((Own<kj::AsyncIoStream,_std::nullptr_t> *)(input + 3));
    (**(code **)(*(long *)amount + 0x18))
              (&local_30,amount,&pAVar1->super_AsyncOutputStream,local_28);
    Maybe<kj::Promise<unsigned_long>_>::Maybe((Maybe<kj::Promise<unsigned_long>_> *)this,&local_30);
    Promise<unsigned_long>::~Promise(&local_30);
    aVar2 = extraout_RDX;
  }
  MVar3.ptr.field_1 = aVar2;
  MVar3.ptr._0_8_ = this;
  return (Maybe<kj::Promise<unsigned_long>_>)MVar3.ptr;
}

Assistant:

kj::Maybe<kj::Promise<uint64_t>> tryPumpFrom(AsyncInputStream& input,
                                               uint64_t amount = kj::maxValue) override {
    if (writeGuardReleased) {
      return input.pumpTo(*inner, amount);
    } else {
      return writeGuard.addBranch().then([this,&input,amount]() {
        return input.pumpTo(*inner, amount);
      });
    }
  }